

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> PVar1;
  int iVar2;
  pointer piVar3;
  pointer pMVar4;
  pointer pMVar5;
  double *pdVar6;
  pointer pFVar7;
  bool bVar8;
  int iVar9;
  double *pdVar10;
  char *pmessage;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  Index othersize;
  long lVar11;
  long lVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vec T;
  Vec sumWsq;
  undefined1 local_b1;
  double local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  double local_88;
  longdouble local_7c;
  int *local_70;
  int *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  lVar11 = (long)this->nInvSolFound;
  local_a8.m_storage.m_data = (double *)0x0;
  local_a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,lVar11,1);
  if (local_a8.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,lVar11,1);
    lVar11 = local_a8.m_storage.m_rows;
  }
  if (0 < lVar11) {
    memset(local_a8.m_storage.m_data,0,lVar11 << 3);
  }
  lVar11 = (long)this->nInvSolFound;
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar11,1);
  if (local_98.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar11,1);
    lVar11 = local_98.m_storage.m_rows;
  }
  if (0 < lVar11) {
    memset(local_98.m_storage.m_data,0,lVar11 << 3);
  }
  iVar9 = this->M;
  if (0 < (long)iVar9) {
    piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
             *)&(((this->experts).
                  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                  .
                  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_x_Norm;
    in_R9 = (longdouble *)0x0;
    do {
      iVar2 = piVar3[(long)in_R9];
      local_a8.m_storage.m_data[iVar2] = pdVar10[(long)in_R9] + local_a8.m_storage.m_data[iVar2];
      local_98.m_storage.m_data[iVar2] =
           *(double *)in_R8 * *(double *)in_R8 + local_98.m_storage.m_data[iVar2];
      in_R9 = (longdouble *)((long)in_R9 + 1);
      in_R8 = in_R8 + 0x1a8;
    } while ((longdouble *)(long)iVar9 != in_R9);
  }
  *worseSol = -1;
  local_70 = newSol1;
  local_68 = newSol2;
  if (this->nInvSolFound < 1) {
    local_b0 = -1.0;
  }
  else {
    lVar11 = 0;
    local_3c = (longdouble)1.79769313486232e+308;
    lVar12 = 0;
    local_b0 = -1.0;
    do {
      dVar15 = local_a8.m_storage.m_data[lVar12] -
               (double)(this->invPredictions).
                       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       .
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar12].
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
               (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data
               [(this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows * lVar12];
      local_a8.m_storage.m_data[lVar12] = dVar15;
      dVar15 = dVar15 / this->sumAll;
      local_a8.m_storage.m_data[lVar12] = dVar15;
      dVar14 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar12];
      dVar14 = (dVar14 * dVar14) / local_98.m_storage.m_data[lVar12] + -1.0 + 1.0;
      lVar13 = in_ST5;
      if ((1.0 <= dVar14) && (0.0 < dVar15)) {
        local_88 = dVar14;
        if (0xffffffffffffe < (long)dVar14 - 1U &&
            ((long)dVar14 < 0 ||
            0x3fe < (uint)((ulong)((long)ABS(dVar14) + -0x10000000000000) >> 0x35))) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",&local_88);
        }
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        pdVar10 = &local_48;
        local_48 = local_88;
        if ((long)local_88 - 1U < 0xfffffffffffff ||
            -1 < (long)local_88 && (uint)((long)ABS(local_88) + 0xfff0000000000000U >> 0x35) < 0x3ff
           ) {
          dVar14 = *(double *)((long)local_a8.m_storage.m_data + lVar11);
          if ((uint)((ulong)((long)ABS(dVar14) + -0x10000000000000) >> 0x35) < 0x3ff &&
              -1 < (long)dVar14 || (ABS(dVar14) == 0.0 || (long)dVar14 - 1U < 0xfffffffffffff)) {
            local_50 = local_88 * 0.5;
            local_58 = dVar14 * 0.5;
            lVar13 = in_ST5;
            boost::math::detail::
            gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x1,(detail *)0x0,(longdouble)local_50,(longdouble)local_58,
                       SUB81(&local_b1,0),false,in_R8,in_R9);
            local_7c = in_ST0;
            if (local_3c < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            }
            local_60 = (double)local_7c;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            if (local_b0 <= local_60) {
              *worseSol = (int)lVar12;
              local_b0 = local_60;
            }
            goto LAB_001489a9;
          }
          pdVar10 = (double *)((long)local_a8.m_storage.m_data + lVar11);
          pmessage = "Chi Square parameter was %1%, but must be > 0 !";
        }
        boost::math::policies::detail::raise_error<std::domain_error,double>
                  (boost::math::
                   cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                   ::function,pmessage,pdVar10);
        lVar13 = in_ST5;
      }
LAB_001489a9:
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 8;
      in_ST5 = lVar13;
    } while (lVar12 < this->nInvSolFound);
  }
  dVar14 = (this->param).multiValuedSignificance;
  if ((dVar14 < local_b0) && (iVar9 = this->M, 0 < iVar9)) {
    piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (this->iInvRj).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar5 = (this->invPredictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar10 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar11 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    pdVar6 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    dVar15 = -1.0;
    lVar12 = 0;
    do {
      iVar2 = piVar3[lVar12];
      if ((iVar2 == *worseSol) &&
         (PVar1.m_storage.m_data.array[0] =
               pMVar5[iVar2].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage,
         dVar16 = ((double)pMVar4[lVar12].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                   (double)PVar1.m_storage.m_data.array[0] - (*pdVar10 + *pdVar10)) *
                  (double)PVar1.m_storage.m_data.array[0] + pdVar6[lVar12], dVar15 < dVar16)) {
        *local_70 = (int)lVar12;
        iVar9 = this->M;
        dVar15 = dVar16;
      }
      lVar12 = lVar12 + 1;
      pdVar10 = pdVar10 + lVar11;
    } while (lVar12 < iVar9);
    if (0 < iVar9) {
      pFVar7 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar4 = (this->iInvRj).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar11 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar6 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar15 = -1.0;
      lVar12 = 0;
      do {
        if ((piVar3[lVar12] == *worseSol) &&
           (PVar1.m_storage.m_data.array[0] =
                 pFVar7[*local_70].super_LinearExpert<1,_1>.pred_z.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage,
           dVar16 = ((double)pMVar4[lVar12].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
                     * (double)PVar1.m_storage.m_data.array[0] - (*pdVar10 + *pdVar10)) *
                    (double)PVar1.m_storage.m_data.array[0] + pdVar6[lVar12], dVar15 < dVar16)) {
          *local_68 = (int)lVar12;
          iVar9 = this->M;
          dVar15 = dVar16;
        }
        lVar12 = lVar12 + 1;
        pdVar10 = pdVar10 + lVar11;
      } while (lVar12 < iVar9);
    }
  }
  bVar8 = local_b0 <= dVar14;
  free(local_98.m_storage.m_data);
  free(local_a8.m_storage.m_data);
  return bVar8;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}